

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytesinkutil.cpp
# Opt level: O3

void icu_63::ByteSinkUtil::appendCodePoint(int32_t length,UChar32 c,ByteSink *sink,Edits *edits)

{
  ulong in_RAX;
  byte bVar1;
  uint uVar2;
  uint uVar3;
  char s8 [4];
  undefined8 uStack_18;
  
  uStack_18._5_3_ = (undefined3)(in_RAX >> 0x28);
  uStack_18._0_4_ = (undefined4)in_RAX;
  if ((uint)c < 0x80) {
    uStack_18._0_5_ = CONCAT14((byte)c,(undefined4)uStack_18);
    uVar3 = 1;
  }
  else {
    if ((uint)c < 0x800) {
      uStack_18 = CONCAT35(uStack_18._5_3_,CONCAT14((char)((uint)c >> 6),(undefined4)uStack_18)) |
                  0xc000000000;
      uVar2 = 1;
    }
    else {
      if ((uint)c < 0x10000) {
        bVar1 = (byte)((uint)c >> 0xc) | 0xe0;
        uVar3 = 1;
        uStack_18 = in_RAX;
      }
      else {
        bVar1 = (byte)((uint)c >> 0x12) | 0xf0;
        uStack_18._6_2_ = (undefined2)(in_RAX >> 0x30);
        uStack_18._0_5_ = (undefined5)in_RAX;
        uStack_18 = CONCAT26(uStack_18._6_2_,CONCAT15((char)((uint)c >> 0xc),(undefined5)uStack_18))
                    & 0xffff3fffffffffff | 0x800000000000;
        uVar3 = 2;
      }
      uStack_18._0_5_ = CONCAT14(bVar1,(undefined4)uStack_18);
      uVar2 = uVar3 + 1;
      *(byte *)((long)&uStack_18 + (ulong)uVar3 + 4) = (byte)((uint)c >> 6) & 0x3f | 0x80;
    }
    uVar3 = uVar2 + 1;
    *(byte *)((long)&uStack_18 + (ulong)uVar2 + 4) = (byte)c & 0x3f | 0x80;
  }
  if (edits != (Edits *)0x0) {
    Edits::addReplace(edits,length,uVar3);
  }
  (*sink->_vptr_ByteSink[2])(sink,(long)&uStack_18 + 4,(ulong)uVar3);
  return;
}

Assistant:

void
ByteSinkUtil::appendCodePoint(int32_t length, UChar32 c, ByteSink &sink, Edits *edits) {
    char s8[U8_MAX_LENGTH];
    int32_t s8Length = 0;
    U8_APPEND_UNSAFE(s8, s8Length, c);
    if (edits != nullptr) {
        edits->addReplace(length, s8Length);
    }
    sink.Append(s8, s8Length);
}